

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstr.cpp
# Opt level: O0

BSTR SysAllocStringLen(OLECHAR *psz,UINT len)

{
  HRESULT HVar1;
  HANDLE hHeap;
  ULONG local_2c;
  OLECHAR *pOStack_28;
  DWORD cbTotal;
  BSTR bstr;
  OLECHAR *pOStack_18;
  UINT len_local;
  OLECHAR *psz_local;
  
  local_2c = 0;
  bstr._4_4_ = len;
  pOStack_18 = psz;
  HVar1 = CbSysStringSize(len,0,&local_2c);
  if (HVar1 < 0) {
    psz_local = (OLECHAR *)0x0;
  }
  else {
    hHeap = GetProcessHeap();
    pOStack_28 = (OLECHAR *)HeapAlloc(hHeap,0,(ulong)local_2c);
    if (pOStack_28 != (OLECHAR *)0x0) {
      pOStack_28[0] = L'\0';
      pOStack_28[1] = L'\0';
      pOStack_28[2] = L'\0';
      pOStack_28[3] = L'\0';
      *(UINT *)(pOStack_28 + 2) = bstr._4_4_ << 1;
      pOStack_28 = pOStack_28 + 4;
      if (pOStack_18 != (OLECHAR *)0x0) {
        memcpy(pOStack_28,pOStack_18,(ulong)bstr._4_4_ << 1);
      }
      pOStack_28[bstr._4_4_] = L'\0';
    }
    psz_local = pOStack_28;
  }
  return psz_local;
}

Assistant:

SysAllocStringLen(const OLECHAR *psz, UINT len)
{

    BSTR bstr;
    DWORD cbTotal = 0;

    if (FAILED(CbSysStringSize(len, FALSE, &cbTotal)))
        return NULL;

    bstr = (OLECHAR *)HeapAlloc(GetProcessHeap(), 0, cbTotal);

    if(bstr != NULL) {

#if defined(_WIN64)
        // NOTE: There are some apps which peek back 4 bytes to look at
        // the size of the BSTR. So, in case of 64-bit code,
        // we need to ensure that the BSTR length can be found by
        // looking one DWORD before the BSTR pointer.
        *(DWORD_PTR *)bstr = (DWORD_PTR) 0;
        bstr = (BSTR) ((char *) bstr + sizeof (DWORD));
#endif
        *(DWORD FAR*)bstr = (DWORD)len * sizeof(OLECHAR);

        bstr = (BSTR) ((char*) bstr + sizeof(DWORD));

        if(psz != NULL){
            memcpy(bstr, psz, len * sizeof(OLECHAR));
        }

        bstr[len] = '\0'; // always 0 terminate
    }

    return bstr;
}